

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidgetlinecontrol.cpp
# Opt level: O0

QString * __thiscall QWidgetLineControl::stripString(QWidgetLineControl *this,QString *str)

{
  int iVar1;
  bool bVar2;
  QChar *rhs;
  qsizetype qVar3;
  int *piVar4;
  type pMVar5;
  QString *in_RDX;
  long in_RSI;
  QString *in_RDI;
  long in_FS_OFFSET;
  int i;
  int end;
  QString *s;
  QString *in_stack_ffffffffffffffa8;
  QString *this_00;
  int local_34;
  int local_c;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = in_RDI;
  bVar2 = std::unique_ptr::operator_cast_to_bool
                    ((unique_ptr<QWidgetLineControl::MaskInputData[],_std::default_delete<QWidgetLineControl::MaskInputData[]>_>
                      *)0x5e0058);
  if (bVar2) {
    (in_RDI->d).d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    (in_RDI->d).ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
    (in_RDI->d).size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    QString::QString((QString *)0x5e009f);
    rhs = (QChar *)(in_RSI + 0x60);
    qVar3 = QString::size(in_RDX);
    local_c = (int)qVar3;
    piVar4 = qMin<int>((int *)rhs,&local_c);
    iVar1 = *piVar4;
    for (local_34 = 0; local_34 < iVar1; local_34 = local_34 + 1) {
      pMVar5 = std::
               unique_ptr<QWidgetLineControl::MaskInputData[],_std::default_delete<QWidgetLineControl::MaskInputData[]>_>
               ::operator[]((unique_ptr<QWidgetLineControl::MaskInputData[],_std::default_delete<QWidgetLineControl::MaskInputData[]>_>
                             *)in_RDI,(size_t)rhs);
      if ((pMVar5->separator & 1U) == 0) {
        QString::operator[](this_00,(qsizetype)in_RDI);
        bVar2 = ::operator!=((QChar *)in_RDI,rhs);
        if (bVar2) {
          QString::operator[](this_00,(qsizetype)in_RDI);
          QString::operator+=(in_RDI,(QChar)(char16_t)((ulong)this_00 >> 0x30));
        }
      }
      else {
        std::
        unique_ptr<QWidgetLineControl::MaskInputData[],_std::default_delete<QWidgetLineControl::MaskInputData[]>_>
        ::operator[]((unique_ptr<QWidgetLineControl::MaskInputData[],_std::default_delete<QWidgetLineControl::MaskInputData[]>_>
                      *)in_RDI,(size_t)rhs);
        QString::operator+=(in_RDI,(QChar)(char16_t)((ulong)this_00 >> 0x30));
      }
    }
  }
  else {
    QString::QString(in_RDI,in_stack_ffffffffffffffa8);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return this_00;
  }
  __stack_chk_fail();
}

Assistant:

QString QWidgetLineControl::stripString(const QString &str) const
{
    if (!m_maskData)
        return str;

    QString s;
    int end = qMin(m_maxLength, (int)str.size());
    for (int i = 0; i < end; ++i)
        if (m_maskData[i].separator)
            s += m_maskData[i].maskChar;
        else
            if (str[i] != m_blank)
                s += str[i];

    return s;
}